

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Record_Query_R_PDU::Decode
          (Record_Query_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer puVar1;
  iterator __position;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  KUINT32 j;
  KString local_50;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x27 < iVar3 + (uint)KVar2) {
    puVar1 = (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    Simulation_Management_Header::Decode
              (&this->super_Simulation_Management_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RqId);
    KDataStream::Read(stream,&(this->super_Reliability_Header).m_ui8ReqRelSrv);
    KDataStream::Read(stream,&(this->super_Reliability_Header).m_ui8Padding);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16EvntTyp);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Time);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumRecs);
    if (this->m_ui32NumRecs != 0) {
      uVar4 = 0;
      do {
        KDataStream::Read<unsigned_int>(stream,(uint *)&local_50);
        __position._M_current =
             (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vui32RecID,
                     __position,(uint *)&local_50);
        }
        else {
          *__position._M_current = (uint)local_50._M_dataplus._M_p;
          (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_ui32NumRecs);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Record_Query_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < RECORD_QUERY_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui32RecID.clear();

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32RqId
           >> m_ui8ReqRelSrv
           >> m_ui8Padding
           >> m_ui16EvntTyp
           >> m_ui32Time
           >> m_ui32NumRecs;

    for( KUINT32 i = 0; i < m_ui32NumRecs; ++i )
    {
        KUINT32 j;
        stream >> j;
        m_vui32RecID.push_back( j );
    }
}